

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPMuxError MuxImagePush(WebPMuxImage *wpi,WebPMuxImage **wpi_list)

{
  WebPMuxImage *pWVar1;
  WebPChunk *pWVar2;
  WebPChunk *pWVar3;
  WebPChunk *pWVar4;
  WebPChunk *pWVar5;
  WebPMuxError WVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  WebPMuxImage *pWVar10;
  WebPMuxImage **ppWVar11;
  WebPMuxImage **ppWVar12;
  
  pWVar10 = *wpi_list;
  do {
    ppWVar12 = wpi_list;
    if (pWVar10 == (WebPMuxImage *)0x0) break;
    ppWVar11 = &pWVar10->next;
    wpi_list = &pWVar10->next;
    pWVar10 = *ppWVar11;
  } while (*ppWVar11 != (WebPMuxImage *)0x0);
  pWVar10 = (WebPMuxImage *)WebPSafeMalloc(1,0x38);
  if (pWVar10 == (WebPMuxImage *)0x0) {
    WVar6 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    pWVar2 = wpi->header;
    pWVar3 = wpi->alpha;
    pWVar4 = wpi->img;
    pWVar5 = wpi->unknown;
    iVar7 = wpi->height;
    iVar8 = wpi->has_alpha;
    iVar9 = wpi->is_partial;
    pWVar10->width = wpi->width;
    pWVar10->height = iVar7;
    pWVar10->has_alpha = iVar8;
    pWVar10->is_partial = iVar9;
    pWVar10->img = pWVar4;
    pWVar10->unknown = pWVar5;
    pWVar10->header = pWVar2;
    pWVar10->alpha = pWVar3;
    pWVar10->next = (WebPMuxImage *)0x0;
    pWVar1 = *ppWVar12;
    ppWVar11 = &pWVar1->next;
    if (pWVar1 == (WebPMuxImage *)0x0) {
      ppWVar11 = ppWVar12;
    }
    *ppWVar11 = pWVar10;
    WVar6 = WEBP_MUX_OK;
  }
  return WVar6;
}

Assistant:

WebPMuxError MuxImagePush(const WebPMuxImage* wpi, WebPMuxImage** wpi_list) {
  WebPMuxImage* new_wpi;

  while (*wpi_list != NULL) {
    WebPMuxImage* const cur_wpi = *wpi_list;
    if (cur_wpi->next == NULL) break;
    wpi_list = &cur_wpi->next;
  }

  new_wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*new_wpi));
  if (new_wpi == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_wpi = *wpi;
  new_wpi->next = NULL;

  if (*wpi_list != NULL) {
    (*wpi_list)->next = new_wpi;
  } else {
    *wpi_list = new_wpi;
  }
  return WEBP_MUX_OK;
}